

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

char * sbuf_read(char *pathname)

{
  int iVar1;
  char *buf;
  int len;
  char *local_18;
  int local_c;
  
  iVar1 = buf_read(pathname,&local_18,&local_c);
  if (iVar1 < 0) {
    free(local_18);
    local_18 = (char *)0x0;
  }
  return local_18;
}

Assistant:

char *sbuf_read(const char *pathname) {
  char *buf;
  int len;

  if (buf_read(pathname, &buf, &len) < 0) {
    FREE(buf);
    buf = NULL;
    return NULL;
  }
  return buf;
}